

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O1

void dic_reinsert_when_resizing(dictionary *dic,keynode *k2)

{
  keynode **ppkVar1;
  bool bVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  puVar3 = (uint *)k2->key;
  uVar4 = 0x811c9dc5;
  uVar5 = (uint)k2->len;
  uVar6 = (uint)k2->len;
  if (7 < uVar5) {
    do {
      uVar4 = (uVar4 ^ puVar3[1] ^ (*puVar3 << 5 | *puVar3 >> 0x1b)) * 0xad3e7;
      uVar5 = uVar6 - 8;
      puVar3 = puVar3 + 2;
      bVar2 = 0xf < (int)uVar6;
      uVar6 = uVar5;
    } while (bVar2);
  }
  if ((uVar5 & 4) != 0) {
    uVar4 = ((uint)*(ushort *)((long)puVar3 + 2) ^ (uVar4 ^ (ushort)*puVar3) * 0xad3e7) * 0xad3e7;
    puVar3 = puVar3 + 1;
  }
  if ((uVar5 & 2) != 0) {
    uVar4 = (uVar4 ^ (ushort)*puVar3) * 0xad3e7;
    puVar3 = (uint *)((long)puVar3 + 2);
  }
  if ((uVar5 & 1) != 0) {
    uVar4 = (uVar4 ^ (int)(char)*puVar3) * 0xad3e7;
  }
  uVar6 = (uVar4 >> 0x10 ^ uVar4) % (uint)dic->length;
  ppkVar1 = dic->table;
  if (ppkVar1[(int)uVar6] == (keynode *)0x0) {
    ppkVar1[(int)uVar6] = k2;
    k2 = dic->table[(int)uVar6];
  }
  else {
    k2->next = ppkVar1[(int)uVar6];
    ppkVar1[(int)uVar6] = k2;
  }
  dic->value = &k2->value;
  return;
}

Assistant:

void dic_reinsert_when_resizing(struct dictionary* dic, struct keynode *k2) {
	int n = hash_func(k2->key, k2->len) % dic->length;
	if (dic->table[n] == 0) {
		dic->table[n] = k2;
		dic->value = &dic->table[n]->value;
		return;
	}
	struct keynode *k = dic->table[n];
	k2->next = k;
	dic->table[n] = k2;
	dic->value = &k2->value;
}